

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

Vec_Ptr_t * Aig_ManScanMapping(Cnf_Man_t *p,int fCollect)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *pAVar7;
  
  pAVar7 = p->pManAig;
  pVVar4 = pAVar7->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if (pVVar4->pArray[lVar3] != (void *)0x0) {
        puVar1 = (uint *)((long)pVVar4->pArray[lVar3] + 0x18);
        *puVar1 = *puVar1 & 0x3f;
        pAVar7 = p->pManAig;
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pAVar7->vObjs;
    } while (lVar3 < pVVar4->nSize);
  }
  if (fCollect == 0) {
    pVVar4 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    pVVar4->pArray = ppvVar5;
  }
  p->aArea = 0;
  pVVar6 = pAVar7->vCos;
  if (0 < pVVar6->nSize) {
    lVar3 = 0;
    do {
      iVar2 = Aig_ManScanMapping_rec
                        (p,(Aig_Obj_t *)
                           (*(ulong *)((long)pVVar6->pArray[lVar3] + 8) & 0xfffffffffffffffe),pVVar4
                        );
      p->aArea = p->aArea + iVar2;
      lVar3 = lVar3 + 1;
      pVVar6 = p->pManAig->vCos;
    } while (lVar3 < pVVar6->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManScanMapping( Cnf_Man_t * p, int fCollect )
{
    Vec_Ptr_t * vMapped = NULL;
    Aig_Obj_t * pObj;
    int i;
    // clean all references
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->nRefs = 0;
    // allocate the array
    if ( fCollect )
        vMapped = Vec_PtrAlloc( 1000 );
    // collect nodes reachable from POs in the DFS order through the best cuts
    p->aArea = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        p->aArea += Aig_ManScanMapping_rec( p, Aig_ObjFanin0(pObj), vMapped );
//    printf( "Variables = %6d. Clauses = %8d.\n", vMapped? Vec_PtrSize(vMapped) + Aig_ManCiNum(p->pManAig) + 1 : 0, p->aArea + 2 );
    return vMapped;
}